

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O3

void Msat_SolverResize(Msat_Solver_t *p,int nVarsAlloc)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  float *pfVar4;
  int *piVar5;
  Msat_ClauseVec_t **ppMVar6;
  Msat_ClauseVec_t *pMVar7;
  Msat_Queue_t *pMVar8;
  Msat_Clause_t **ppMVar9;
  Msat_IntVec_t *Entry;
  long lVar10;
  size_t sVar11;
  int iVar12;
  long lVar13;
  
  uVar1 = p->nVarsAlloc;
  lVar13 = (long)(int)uVar1;
  p->nVarsAlloc = nVarsAlloc;
  if (p->pdActivity == (double *)0x0) {
    pdVar3 = (double *)malloc((long)nVarsAlloc << 3);
  }
  else {
    pdVar3 = (double *)realloc(p->pdActivity,(long)nVarsAlloc << 3);
  }
  p->pdActivity = pdVar3;
  iVar12 = p->nVarsAlloc;
  if (p->pFactors == (float *)0x0) {
    pfVar4 = (float *)malloc((long)iVar12 * 4);
  }
  else {
    pfVar4 = (float *)realloc(p->pFactors,(long)iVar12 * 4);
    iVar12 = p->nVarsAlloc;
  }
  p->pFactors = pfVar4;
  if ((int)uVar1 < iVar12) {
    pdVar3 = p->pdActivity;
    lVar10 = lVar13;
    do {
      pdVar3[lVar10] = 0.0;
      pfVar4[lVar10] = 1.0;
      lVar10 = lVar10 + 1;
    } while (iVar12 != lVar10);
  }
  sVar11 = (long)iVar12 << 2;
  if (p->pAssigns == (int *)0x0) {
    piVar5 = (int *)malloc(sVar11);
  }
  else {
    piVar5 = (int *)realloc(p->pAssigns,sVar11);
  }
  p->pAssigns = piVar5;
  iVar12 = p->nVarsAlloc;
  if (p->pModel == (int *)0x0) {
    piVar5 = (int *)malloc((long)iVar12 * 4);
  }
  else {
    piVar5 = (int *)realloc(p->pModel,(long)iVar12 * 4);
    iVar12 = p->nVarsAlloc;
  }
  p->pModel = piVar5;
  if ((int)uVar1 < iVar12) {
    piVar5 = p->pAssigns;
    lVar10 = lVar13;
    do {
      piVar5[lVar10] = -1;
      lVar10 = lVar10 + 1;
      iVar12 = p->nVarsAlloc;
    } while (lVar10 < iVar12);
  }
  Msat_OrderSetBounds(p->pOrder,iVar12);
  iVar12 = p->nVarsAlloc;
  if (p->pvWatched == (Msat_ClauseVec_t **)0x0) {
    ppMVar6 = (Msat_ClauseVec_t **)malloc((long)iVar12 << 4);
  }
  else {
    ppMVar6 = (Msat_ClauseVec_t **)realloc(p->pvWatched,(long)iVar12 << 4);
    iVar12 = p->nVarsAlloc;
  }
  p->pvWatched = ppMVar6;
  if ((int)uVar1 < iVar12) {
    lVar10 = (long)(int)(uVar1 * 2);
    do {
      pMVar7 = Msat_ClauseVecAlloc(0x10);
      p->pvWatched[lVar10] = pMVar7;
      lVar10 = lVar10 + 1;
    } while (SBORROW8(lVar10,(long)p->nVarsAlloc * 2) != lVar10 + (long)p->nVarsAlloc * -2 < 0);
  }
  Msat_QueueFree(p->pQueue);
  pMVar8 = Msat_QueueAlloc(p->nVarsAlloc);
  p->pQueue = pMVar8;
  sVar11 = (long)p->nVarsAlloc << 3;
  if (p->pReasons == (Msat_Clause_t **)0x0) {
    ppMVar9 = (Msat_Clause_t **)malloc(sVar11);
  }
  else {
    ppMVar9 = (Msat_Clause_t **)realloc(p->pReasons,sVar11);
  }
  p->pReasons = ppMVar9;
  iVar12 = p->nVarsAlloc;
  if (p->pLevel == (int *)0x0) {
    piVar5 = (int *)malloc((long)iVar12 * 4);
  }
  else {
    piVar5 = (int *)realloc(p->pLevel,(long)iVar12 * 4);
    iVar12 = p->nVarsAlloc;
  }
  p->pLevel = piVar5;
  lVar10 = lVar13;
  if ((int)uVar1 < iVar12) {
    do {
      p->pReasons[lVar10] = (Msat_Clause_t *)0x0;
      p->pLevel[lVar10] = -1;
      lVar10 = lVar10 + 1;
      iVar12 = p->nVarsAlloc;
    } while (lVar10 < iVar12);
  }
  if (p->pSeen == (int *)0x0) {
    piVar5 = (int *)malloc((long)iVar12 << 2);
  }
  else {
    piVar5 = (int *)realloc(p->pSeen,(long)iVar12 << 2);
    iVar12 = p->nVarsAlloc;
  }
  p->pSeen = piVar5;
  if ((int)uVar1 < iVar12) {
    memset(piVar5 + lVar13,0,(ulong)(~uVar1 + iVar12) * 4 + 4);
  }
  Msat_IntVecGrow(p->vTrail,iVar12);
  Msat_IntVecGrow(p->vTrailLim,p->nVarsAlloc);
  iVar2 = Msat_ClauseVecReadSize(p->vAdjacents);
  iVar12 = p->nVarsAlloc;
  if (iVar2 < iVar12) {
    do {
      pMVar7 = p->vAdjacents;
      Entry = Msat_IntVecAlloc(5);
      Msat_ClauseVecPush(pMVar7,(Msat_Clause_t *)Entry);
      iVar2 = iVar2 + 1;
      iVar12 = p->nVarsAlloc;
    } while (iVar2 < iVar12);
  }
  Msat_IntVecFill(p->vVarsUsed,iVar12,1);
  return;
}

Assistant:

void Msat_SolverResize( Msat_Solver_t * p, int nVarsAlloc )
{
    int nVarsAllocOld, i;

    nVarsAllocOld = p->nVarsAlloc;
    p->nVarsAlloc = nVarsAlloc;

    p->pdActivity = ABC_REALLOC( double, p->pdActivity, p->nVarsAlloc );
    p->pFactors   = ABC_REALLOC( float, p->pFactors, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
    {
        p->pdActivity[i] = 0.0;
        p->pFactors[i]   = 1.0;
    }

    p->pAssigns  = ABC_REALLOC( int, p->pAssigns, p->nVarsAlloc );
    p->pModel    = ABC_REALLOC( int, p->pModel, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;

//    Msat_OrderRealloc( p->pOrder, p->pAssigns, p->pdActivity, p->nVarsAlloc );
    Msat_OrderSetBounds( p->pOrder, p->nVarsAlloc );

    p->pvWatched = ABC_REALLOC( Msat_ClauseVec_t *, p->pvWatched, 2 * p->nVarsAlloc );
    for ( i = 2 * nVarsAllocOld; i < 2 * p->nVarsAlloc; i++ )
        p->pvWatched[i] = Msat_ClauseVecAlloc( 16 );

    Msat_QueueFree( p->pQueue );
    p->pQueue    = Msat_QueueAlloc( p->nVarsAlloc );

    p->pReasons  = ABC_REALLOC( Msat_Clause_t *, p->pReasons, p->nVarsAlloc );
    p->pLevel    = ABC_REALLOC( int, p->pLevel, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
    {
        p->pReasons[i] = NULL;
        p->pLevel[i] = -1;
    }

    p->pSeen     = ABC_REALLOC( int, p->pSeen, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
        p->pSeen[i] = 0;

    Msat_IntVecGrow( p->vTrail, p->nVarsAlloc );
    Msat_IntVecGrow( p->vTrailLim, p->nVarsAlloc );

    // make sure the array of adjucents has room to store the variable numbers
    for ( i = Msat_ClauseVecReadSize(p->vAdjacents); i < p->nVarsAlloc; i++ )
        Msat_ClauseVecPush( p->vAdjacents, (Msat_Clause_t *)Msat_IntVecAlloc(5) );
    Msat_IntVecFill( p->vVarsUsed, p->nVarsAlloc, 1 );
}